

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O2

void T42_Face_Done(FT_Face t42face)

{
  FT_Memory memory;
  T42_Face face;
  
  if (t42face != (FT_Face)0x0) {
    memory = t42face->memory;
    if ((FT_Face)t42face[3].available_sizes != (FT_Face)0x0) {
      FT_Done_Face((FT_Face)t42face[3].available_sizes);
    }
    ft_mem_free(memory,(void *)t42face[1].num_faces);
    t42face[1].num_faces = 0;
    ft_mem_free(memory,(void *)t42face[1].face_index);
    t42face[1].face_index = 0;
    ft_mem_free(memory,(void *)t42face[1].face_flags);
    t42face[1].face_flags = 0;
    ft_mem_free(memory,(void *)t42face[1].style_flags);
    t42face[1].style_flags = 0;
    ft_mem_free(memory,(void *)t42face[1].num_glyphs);
    t42face[1].num_glyphs = 0;
    ft_mem_free(memory,t42face[2].charmap);
    t42face[2].charmap = (FT_CharMap)0x0;
    ft_mem_free(memory,t42face[2].size);
    t42face[2].size = (FT_Size)0x0;
    ft_mem_free(memory,t42face[2].glyph);
    t42face[2].glyph = (FT_GlyphSlot)0x0;
    ft_mem_free(memory,t42face[2].generic.finalizer);
    t42face[2].generic.finalizer = (FT_Generic_Finalizer)0x0;
    ft_mem_free(memory,(void *)t42face[2].bbox.xMin);
    t42face[2].bbox.xMin = 0;
    ft_mem_free(memory,*(void **)&t42face[2].num_charmaps);
    *(undefined8 *)&t42face[2].num_charmaps = 0;
    ft_mem_free(memory,t42face[2].charmaps);
    t42face[2].charmaps = (FT_CharMap *)0x0;
    ft_mem_free(memory,t42face[2].family_name);
    t42face[2].family_name = (FT_String *)0x0;
    ft_mem_free(memory,t42face[3].style_name);
    t42face[3].style_name = (FT_String *)0x0;
    ft_mem_free(memory,t42face[3].glyph);
    t42face[3].glyph = (FT_GlyphSlot)0x0;
    t42face[3].max_advance_width = 0;
    t42face[3].max_advance_height = 0;
    t42face->family_name = (FT_String *)0x0;
    t42face->style_name = (FT_String *)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  T42_Face_Done( FT_Face  t42face )
  {
    T42_Face     face = (T42_Face)t42face;
    T1_Font      type1;
    PS_FontInfo  info;
    FT_Memory    memory;


    if ( !face )
      return;

    type1  = &face->type1;
    info   = &type1->font_info;
    memory = face->root.memory;

    /* delete internal ttf face prior to freeing face->ttf_data */
    if ( face->ttf_face )
      FT_Done_Face( face->ttf_face );

    /* release font info strings */
    FT_FREE( info->version );
    FT_FREE( info->notice );
    FT_FREE( info->full_name );
    FT_FREE( info->family_name );
    FT_FREE( info->weight );

    /* release top dictionary */
    FT_FREE( type1->charstrings_len );
    FT_FREE( type1->charstrings );
    FT_FREE( type1->glyph_names );

    FT_FREE( type1->charstrings_block );
    FT_FREE( type1->glyph_names_block );

    FT_FREE( type1->encoding.char_index );
    FT_FREE( type1->encoding.char_name );
    FT_FREE( type1->font_name );

    FT_FREE( face->ttf_data );

#if 0
    /* release afm data if present */
    if ( face->afm_data )
      T1_Done_AFM( memory, (T1_AFM*)face->afm_data );
#endif

    /* release unicode map, if any */
    FT_FREE( face->unicode_map.maps );
    face->unicode_map.num_maps = 0;

    face->root.family_name = NULL;
    face->root.style_name  = NULL;
  }